

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O3

int event_remove_timer_nolock_(event *ev)

{
  event_base *base;
  void *lock_;
  int iVar1;
  
  base = ev->ev_base;
  lock_ = base->th_base_lock;
  if ((lock_ != (void *)0x0) && (evthread_lock_debugging_enabled_ != 0)) {
    iVar1 = evthread_is_debug_lock_held_(lock_);
    if (iVar1 == 0) {
      event_remove_timer_nolock__cold_1();
    }
  }
  event_debug_assert_is_setup_(ev);
  if (event_debug_logging_mask_ != 0) {
    event_debugx_("event_remove_timer_nolock: event: %p",ev);
  }
  if (((ev->ev_evcallback).evcb_flags & 1) != 0) {
    event_queue_remove_timeout(base,ev);
    (ev->ev_).ev_io.ev_timeout.tv_sec = 0;
    (ev->ev_).ev_io.ev_timeout.tv_usec = 0;
  }
  return 0;
}

Assistant:

int
event_remove_timer_nolock_(struct event *ev)
{
	struct event_base *base = ev->ev_base;

	EVENT_BASE_ASSERT_LOCKED(base);
	event_debug_assert_is_setup_(ev);

	event_debug(("event_remove_timer_nolock: event: %p", ev));

	/* If it's not pending on a timeout, we don't need to do anything. */
	if (ev->ev_flags & EVLIST_TIMEOUT) {
		event_queue_remove_timeout(base, ev);
		evutil_timerclear(&ev->ev_.ev_io.ev_timeout);
	}

	return (0);
}